

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifra.c
# Opt level: O0

int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx,int is_enc,void *key,size_t key_size)

{
  aesgcm_context_t *ctx;
  size_t key_size_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  _ctx->dispose_crypto = aesgcm_dispose_crypto;
  if (is_enc == 0) {
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    _ctx->do_decrypt = aesgcm_decrypt;
  }
  else {
    _ctx->do_encrypt_init = aesgcm_encrypt_init;
    _ctx->do_encrypt_update = aesgcm_encrypt_update;
    _ctx->do_encrypt_final = aesgcm_encrypt_final;
    _ctx->do_decrypt =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_void_ptr_void_ptr_size_t
          *)0x0;
  }
  cf_aes_init((cf_aes_context *)(_ctx + 1),(uint8_t *)key,key_size);
  return 0;
}

Assistant:

static int aead_aesgcm_setup_crypto(ptls_aead_context_t *_ctx, int is_enc, const void *key, size_t key_size)
{
    struct aesgcm_context_t *ctx = (struct aesgcm_context_t *)_ctx;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    if (is_enc) {
        ctx->super.do_encrypt_init = aesgcm_encrypt_init;
        ctx->super.do_encrypt_update = aesgcm_encrypt_update;
        ctx->super.do_encrypt_final = aesgcm_encrypt_final;
        ctx->super.do_decrypt = NULL;
    } else {
        ctx->super.do_encrypt_init = NULL;
        ctx->super.do_encrypt_update = NULL;
        ctx->super.do_encrypt_final = NULL;
        ctx->super.do_decrypt = aesgcm_decrypt;
    }

    cf_aes_init(&ctx->aes, key, key_size);
    return 0;
}